

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_predictor_16x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined1 uVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar6 = psadbw(*(undefined1 (*) [16])left,(undefined1  [16])0x0);
  auVar8 = psadbw(*(undefined1 (*) [16])(left + 0x10),(undefined1  [16])0x0);
  auVar7 = psadbw(*(undefined1 (*) [16])(left + 0x20),(undefined1  [16])0x0);
  auVar9 = psadbw(*(undefined1 (*) [16])(left + 0x30),(undefined1  [16])0x0);
  auVar4 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])above);
  iVar1 = (CONCAT22(auVar4._10_2_ + auVar4._2_2_ +
                    auVar9._2_2_ + auVar7._2_2_ + auVar8._2_2_ + auVar6._2_2_ +
                    auVar9._10_2_ + auVar7._10_2_ + auVar8._10_2_ + auVar6._10_2_,
                    auVar4._8_2_ + auVar4._0_2_ +
                    auVar9._0_2_ + auVar7._0_2_ + auVar8._0_2_ + auVar6._0_2_ +
                    auVar9._8_2_ + auVar7._8_2_ + auVar8._8_2_ + auVar6._8_2_) + 0x28U >> 4) *
          0x3334;
  uVar5 = (undefined1)((uint)iVar1 >> 0x18);
  uVar2 = (undefined1)((uint)iVar1 >> 0x10);
  auVar4 = ZEXT416(CONCAT22(CONCAT11(uVar5,uVar5),CONCAT11(uVar2,uVar2)));
  auVar4 = pshuflw(auVar4,auVar4,0);
  uVar3 = auVar4._0_4_;
  iVar1 = 0x40;
  do {
    *(undefined4 *)dst = uVar3;
    *(undefined4 *)(dst + 4) = uVar3;
    *(undefined4 *)(dst + 8) = uVar3;
    *(undefined4 *)(dst + 0xc) = uVar3;
    dst = dst + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_64(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  __m128i x2 = _mm_load_si128((__m128i const *)(ref + 32));
  __m128i x3 = _mm_load_si128((__m128i const *)(ref + 48));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x2 = _mm_sad_epu8(x2, zero);
  x3 = _mm_sad_epu8(x3, zero);
  x0 = _mm_add_epi16(x0, x1);
  x2 = _mm_add_epi16(x2, x3);
  x0 = _mm_add_epi16(x0, x2);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}